

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# structure.c
# Opt level: O1

LY_ERR structure_compile(lysc_ctx *cctx,lysp_ext_instance *extp,lysc_ext_instance *ext)

{
  uint32_t uVar1;
  lysc_ext_substmt *plVar2;
  void **ppvVar3;
  int iVar4;
  LY_ERR LVar5;
  uint32_t *puVar6;
  void **ppvVar7;
  long *plVar8;
  LY_ERR LVar9;
  uint16_t *puVar10;
  char *format;
  char *pcVar11;
  
  puVar6 = lyplg_ext_compile_get_options(cctx);
  uVar1 = *puVar6;
  puVar10 = *(uint16_t **)((long)ext->parent + 8);
  if (puVar10 != (uint16_t *)0x0) {
    pcVar11 = ext->argument;
    do {
      iVar4 = strcmp(*(char **)(puVar10 + 0x14),pcVar11);
      if (iVar4 == 0) {
        pcVar11 = extp->name;
        lys_nodetype2str(*puVar10);
        format = "Extension %s collides with a %s with the same identifier.";
        LVar9 = LY_EVALID;
        LVar5 = LY_EVALID;
        goto LAB_001a4793;
      }
      puVar10 = *(uint16_t **)(puVar10 + 0xc);
    } while (puVar10 != (uint16_t *)0x0);
  }
  ppvVar7 = (void **)calloc(1,0x28);
  if (ppvVar7 != (void **)0x0) {
    ext->compiled = ppvVar7;
    plVar2 = ext->substmts;
    if (plVar2 == (lysc_ext_substmt *)0x0) {
      plVar8 = (long *)calloc(1,0xe8);
    }
    else {
      plVar8 = (long *)realloc(&plVar2[-1].storage_p,(long)plVar2[-1].storage_p * 0x10 + 0xe8);
    }
    if (plVar8 == (long *)0x0) {
      iVar4 = 5;
    }
    else {
      ext->substmts = (lysc_ext_substmt *)(plVar8 + 1);
      iVar4 = 0;
      memset(plVar8 + *plVar8 * 2 + 1,0,0xe0);
    }
    if (iVar4 != 5) {
      if (iVar4 != 0) {
        return (LY_ERR)puVar10;
      }
      plVar2 = ext->substmts;
      ppvVar3 = plVar2[-1].storage_p;
      plVar2->stmt = LY_STMT_MUST;
      plVar2->storage_p = ppvVar7;
      plVar2[1].stmt = LY_STMT_STATUS;
      plVar2[1].storage_p = ppvVar7 + 1;
      plVar2[2].stmt = LY_STMT_DESCRIPTION;
      plVar2[2].storage_p = ppvVar7 + 2;
      plVar2[3].stmt = LY_STMT_REFERENCE;
      plVar2[3].storage_p = ppvVar7 + 3;
      plVar2[4].stmt = LY_STMT_TYPEDEF;
      plVar2[4].storage_p = (void **)0x0;
      plVar2[5].stmt = LY_STMT_GROUPING;
      plVar2[5].storage_p = (void **)0x0;
      plVar2[6].stmt = LY_STMT_CONTAINER;
      ppvVar7 = ppvVar7 + 4;
      plVar2[6].storage_p = ppvVar7;
      plVar2[-1].storage_p = ppvVar3 + 1;
      plVar2[7].stmt = LY_STMT_LEAF;
      plVar2[7].storage_p = ppvVar7;
      plVar2[-1].storage_p = (void **)((long)ppvVar3 + 9);
      plVar2[8].stmt = LY_STMT_LEAF_LIST;
      plVar2[8].storage_p = ppvVar7;
      plVar2[-1].storage_p = (void **)((long)ppvVar3 + 10);
      plVar2[9].stmt = LY_STMT_LIST;
      plVar2[9].storage_p = ppvVar7;
      plVar2[-1].storage_p = (void **)((long)ppvVar3 + 0xb);
      plVar2[10].stmt = LY_STMT_CHOICE;
      plVar2[10].storage_p = ppvVar7;
      plVar2[-1].storage_p = (void **)((long)ppvVar3 + 0xc);
      plVar2[0xb].stmt = LY_STMT_ANYDATA;
      plVar2[0xb].storage_p = ppvVar7;
      plVar2[-1].storage_p = (void **)((long)ppvVar3 + 0xd);
      plVar2[0xc].stmt = LY_STMT_ANYXML;
      plVar2[0xc].storage_p = ppvVar7;
      plVar2[-1].storage_p = (void **)((long)ppvVar3 + 0xe);
      plVar2[0xd].stmt = LY_STMT_USES;
      plVar2[0xd].storage_p = ppvVar7;
      puVar6 = lyplg_ext_compile_get_options(cctx);
      *(byte *)puVar6 = (byte)*puVar6 | 0xc;
      LVar5 = lyplg_ext_compile_extension_instance(cctx,extp,ext);
      puVar6 = lyplg_ext_compile_get_options(cctx);
      *puVar6 = uVar1;
      return LVar5;
    }
  }
  format = "Memory allocation failed (%s()).";
  pcVar11 = "structure_compile";
  LVar9 = LY_EMEM;
  LVar5 = LY_EMEM;
LAB_001a4793:
  lyplg_ext_compile_log(cctx,ext,LY_LLERR,LVar5,format,pcVar11);
  return LVar9;
}

Assistant:

static LY_ERR
structure_compile(struct lysc_ctx *cctx, const struct lysp_ext_instance *extp, struct lysc_ext_instance *ext)
{
    LY_ERR rc;
    struct lysc_module *mod_c;
    const struct lysc_node *child;
    struct lysc_ext_instance_structure *struct_cdata;
    uint32_t prev_options = *lyplg_ext_compile_get_options(cctx);

    mod_c = ext->parent;

    /* check identifier namespace with the compiled nodes */
    LY_LIST_FOR(mod_c->data, child) {
        if (!strcmp(child->name, ext->argument)) {
            /* identifier collision */
            lyplg_ext_compile_log(cctx, ext, LY_LLERR, LY_EVALID,  "Extension %s collides with a %s with the same identifier.",
                    extp->name, lys_nodetype2str(child->nodetype));
            return LY_EVALID;
        }
    }

    /* allocate the storage */
    struct_cdata = calloc(1, sizeof *struct_cdata);
    if (!struct_cdata) {
        goto emem;
    }
    ext->compiled = struct_cdata;

    /* compile substatements */
    LY_ARRAY_CREATE_GOTO(cctx->ctx, ext->substmts, 14, rc, emem);
    LY_ARRAY_INCREMENT(ext->substmts);
    ext->substmts[0].stmt = LY_STMT_MUST;
    ext->substmts[0].storage_p = (void **)&struct_cdata->musts;

    LY_ARRAY_INCREMENT(ext->substmts);
    ext->substmts[1].stmt = LY_STMT_STATUS;
    ext->substmts[1].storage_p = (void **)&struct_cdata->flags;

    LY_ARRAY_INCREMENT(ext->substmts);
    ext->substmts[2].stmt = LY_STMT_DESCRIPTION;
    ext->substmts[2].storage_p = (void **)&struct_cdata->dsc;

    LY_ARRAY_INCREMENT(ext->substmts);
    ext->substmts[3].stmt = LY_STMT_REFERENCE;
    ext->substmts[3].storage_p = (void **)&struct_cdata->ref;

    LY_ARRAY_INCREMENT(ext->substmts);
    ext->substmts[4].stmt = LY_STMT_TYPEDEF;
    ext->substmts[4].storage_p = 0;

    LY_ARRAY_INCREMENT(ext->substmts);
    ext->substmts[5].stmt = LY_STMT_GROUPING;
    ext->substmts[5].storage_p = 0;

    /* data-def-stmt */
    LY_ARRAY_INCREMENT(ext->substmts);
    ext->substmts[6].stmt = LY_STMT_CONTAINER;
    ext->substmts[6].storage_p = (void **)&struct_cdata->child;

    LY_ARRAY_INCREMENT(ext->substmts);
    ext->substmts[7].stmt = LY_STMT_LEAF;
    ext->substmts[7].storage_p = (void **)&struct_cdata->child;

    LY_ARRAY_INCREMENT(ext->substmts);
    ext->substmts[8].stmt = LY_STMT_LEAF_LIST;
    ext->substmts[8].storage_p = (void **)&struct_cdata->child;

    LY_ARRAY_INCREMENT(ext->substmts);
    ext->substmts[9].stmt = LY_STMT_LIST;
    ext->substmts[9].storage_p = (void **)&struct_cdata->child;

    LY_ARRAY_INCREMENT(ext->substmts);
    ext->substmts[10].stmt = LY_STMT_CHOICE;
    ext->substmts[10].storage_p = (void **)&struct_cdata->child;

    LY_ARRAY_INCREMENT(ext->substmts);
    ext->substmts[11].stmt = LY_STMT_ANYDATA;
    ext->substmts[11].storage_p = (void **)&struct_cdata->child;

    LY_ARRAY_INCREMENT(ext->substmts);
    ext->substmts[12].stmt = LY_STMT_ANYXML;
    ext->substmts[12].storage_p = (void **)&struct_cdata->child;

    LY_ARRAY_INCREMENT(ext->substmts);
    ext->substmts[13].stmt = LY_STMT_USES;
    ext->substmts[13].storage_p = (void **)&struct_cdata->child;

    *lyplg_ext_compile_get_options(cctx) |= LYS_COMPILE_NO_CONFIG | LYS_COMPILE_NO_DISABLED;
    rc = lyplg_ext_compile_extension_instance(cctx, extp, ext);
    *lyplg_ext_compile_get_options(cctx) = prev_options;
    if (rc) {
        return rc;
    }

    return LY_SUCCESS;

emem:
    lyplg_ext_compile_log(cctx, ext, LY_LLERR, LY_EMEM, "Memory allocation failed (%s()).", __func__);
    return LY_EMEM;
}